

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int pythonDbusPresent(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char lPythonParams [256];
  char lPythonCommand [256];
  undefined1 auStack_218 [256];
  char local_118 [264];
  
  memcpy(auStack_218,
         "-c \"try:\n\timport dbus;bus=dbus.SessionBus();notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');\nexcept:\n\tprint(0);\""
         ,0x100);
  if (pythonDbusPresent::lDbusPresent < 0) {
    pythonDbusPresent::lDbusPresent = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      strcpy(gPythonName,gPython2Name);
      sprintf(local_118,"%s %s",gPythonName,auStack_218);
      pythonDbusPresent::lDbusPresent = tryCommand(local_118);
    }
    if (pythonDbusPresent::lDbusPresent == 0) {
      iVar1 = python3Present();
      if (iVar1 != 0) {
        strcpy(gPythonName,gPython3Name);
        sprintf(local_118,"%s %s",gPythonName,auStack_218);
        pythonDbusPresent::lDbusPresent = tryCommand(local_118);
      }
    }
    if (tinyfd_verbose != 0) {
      printf("lDbusPresent %d\n",(ulong)(uint)pythonDbusPresent::lDbusPresent);
    }
    if (tinyfd_verbose != 0) {
      printf("gPythonName %s\n",gPythonName);
    }
  }
  uVar3 = 0;
  if (pythonDbusPresent::lDbusPresent != 0) {
    iVar1 = graphicMode();
    if (iVar1 != 0) {
      iVar1 = isDarwin();
      if (iVar1 == 0) {
        uVar3 = 1;
      }
      else {
        pcVar2 = getenv("SSH_TTY");
        uVar3 = (uint)(pcVar2 == (char *)0x0);
      }
    }
  }
  return uVar3;
}

Assistant:

static int pythonDbusPresent( )
{
    static int lDbusPresent = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
"-c \"try:\n\timport dbus;bus=dbus.SessionBus();\
notif=bus.get_object('org.freedesktop.Notifications','/org/freedesktop/Notifications');\
notify=dbus.Interface(notif,'org.freedesktop.Notifications');\nexcept:\n\tprint(0);\"";

        if ( lDbusPresent < 0 )
        {
                lDbusPresent = 0 ;
                if ( python2Present() )
                {
                        strcpy(gPythonName , gPython2Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lDbusPresent = tryCommand(lPythonCommand) ;
                }

                if ( ! lDbusPresent && python3Present() )
                {
                        strcpy(gPythonName , gPython3Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lDbusPresent = tryCommand(lPythonCommand) ;
                }

                if (tinyfd_verbose) printf("lDbusPresent %d\n", lDbusPresent) ;
                if (tinyfd_verbose) printf("gPythonName %s\n", gPythonName) ;
        }
        return lDbusPresent && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}